

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O1

bool __thiscall r_exec::HLPOverlay::evaluate_bwd_guards(HLPOverlay *this)

{
  byte bVar1;
  bool bVar2;
  short sVar3;
  short sVar4;
  uint16_t index;
  bool bVar5;
  HLPContext c;
  uint16_t local_56;
  uint local_54;
  HLPContext local_50;
  
  sVar3 = r_code::Atom::asIndex();
  bVar1 = r_code::Atom::getAtomCount();
  bVar5 = bVar1 == 0;
  if (!bVar5) {
    HLPContext::HLPContext(&local_50,(this->super_Overlay).code,sVar3 + 1,this,STEM);
    bVar2 = HLPContext::evaluate(&local_50,&local_56);
    if (bVar2) {
      local_54 = (uint)bVar1;
      index = sVar3 + 2;
      sVar3 = -1;
      do {
        sVar4 = sVar3;
        if ((ushort)-(ushort)bVar1 == sVar4) break;
        HLPContext::HLPContext(&local_50,(this->super_Overlay).code,index,this,STEM);
        bVar5 = HLPContext::evaluate(&local_50,&local_56);
        index = index + 1;
        sVar3 = sVar4 + -1;
      } while (bVar5);
      bVar5 = (ushort)local_54 <= (ushort)-sVar4;
    }
  }
  return bVar5;
}

Assistant:

bool HLPOverlay::evaluate_bwd_guards()
{
    return evaluate_guards(HLP_BWD_GUARDS);
}